

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O1

string * __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,MultiAgentDecisionProcessDiscreteFactoredStates *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  stringstream ss;
  string local_1c8;
  stringstream local_1a8 [16];
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  MultiAgentDecisionProcess::SoftPrint_abi_cxx11_(&local_1c8,&this->super_MultiAgentDecisionProcess)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  paVar1 = &local_1c8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  MADPComponentFactoredStates::SoftPrint_abi_cxx11_(&local_1c8,&this->_m_S);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  MADPComponentDiscreteActions::SoftPrint_abi_cxx11_(&local_1c8,&this->_m_A);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  MADPComponentDiscreteObservations::SoftPrint_abi_cxx11_(&local_1c8,&this->_m_O);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  TwoStageDynamicBayesianNetwork::SoftPrint_abi_cxx11_(&local_1c8,&this->_m_2dbn);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (this->_m_initialized == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Transition model: ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"(not yet implemented)",0x15);
    cVar2 = (char)(ostream *)local_198;
    std::ios::widen((char)*(undefined8 *)(local_198[0] + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Observation model: ",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"(not yet implemented)",0x15);
    std::ios::widen((char)*(undefined8 *)(local_198[0] + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

string MultiAgentDecisionProcessDiscreteFactoredStates::SoftPrint() const
{
    stringstream ss;

    ss << MultiAgentDecisionProcess::SoftPrint();
    ss << _m_S.SoftPrint();
    ss << _m_A.SoftPrint();
    ss << _m_O.SoftPrint();   
    ss << _m_2dbn.SoftPrint();
    if(_m_initialized)
    {
        ss << "Transition model: " << 
            "(not yet implemented)"
            << endl;
        //ss << _m_p_tModel->SoftPrint();
        ss << "Observation model: " << 
            "(not yet implemented)"
            << endl;
        //ss << _m_p_oModel->SoftPrint();
    }
    return(ss.str());
}